

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipper.cpp
# Opt level: O3

bool __thiscall
ClipperLib::Clipper::Execute
          (Clipper *this,ClipType clipType,Polygons *solution,PolyFillType subjFillType,
          PolyFillType clipFillType)

{
  char cVar1;
  int iVar2;
  
  if (this->m_ExecuteLocked == false) {
    this->m_ExecuteLocked = true;
    std::
    vector<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
    ::resize(solution,0);
    this->m_SubjFillType = subjFillType;
    this->m_ClipFillType = clipFillType;
    this->m_ClipType = clipType;
    iVar2 = (*this->_vptr_Clipper[4])(this,0);
    cVar1 = (char)iVar2;
    if (cVar1 != '\0') {
      BuildResult(this,solution);
    }
    this->m_ExecuteLocked = false;
  }
  else {
    cVar1 = '\0';
  }
  return (bool)cVar1;
}

Assistant:

bool Clipper::Execute(ClipType clipType, Polygons &solution,
    PolyFillType subjFillType, PolyFillType clipFillType)
{
  if( m_ExecuteLocked ) return false;
  m_ExecuteLocked = true;
  solution.resize(0);
  m_SubjFillType = subjFillType;
  m_ClipFillType = clipFillType;
  m_ClipType = clipType;
  bool succeeded = ExecuteInternal(false);
  if (succeeded) BuildResult(solution);
  m_ExecuteLocked = false;
  return succeeded;
}